

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_file.hpp
# Opt level: O3

bool __thiscall
coro_io::basic_seq_coro_file<(coro_io::execution_type)1>::open_stream_file_in_pool
          (basic_seq_coro_file<(coro_io::execution_type)1> *this,string_view filepath,openmode flags
          )

{
  char cVar1;
  bool *pbVar2;
  Lazy<async_simple::Try<bool>_> *lazy;
  undefined1 uVar3;
  Lazy<async_simple::Try<bool>_> coro_func;
  Try<bool> result;
  undefined8 *local_40;
  _Variant_storage<false,_std::monostate,_bool,_std::__exception_ptr::exception_ptr> local_38;
  
  cVar1 = std::__basic_file<char>::is_open();
  uVar3 = 1;
  if (cVar1 == '\0') {
    local_40 = (undefined8 *)operator_new(0x90,(nothrow_t *)&std::nothrow);
    if (local_40 == (undefined8 *)0x0) {
      local_40 = (undefined8 *)0x0;
    }
    else {
      *local_40 = 
      post<coro_io::basic_seq_coro_file<(coro_io::execution_type)1>::open_stream_file_in_pool(std::basic_string_view<char,std::char_traits<char>>,std::_Ios_Openmode)::_lambda()_1_>
      ;
      local_40[1] = 
      post<coro_io::basic_seq_coro_file<(coro_io::execution_type)1>::open_stream_file_in_pool(std::basic_string_view<char,std::char_traits<char>>,std::_Ios_Openmode)::_lambda()_1_>
      ;
      local_40[0x10] = this;
      local_40[8] = this;
      *(openmode *)(local_40 + 9) = flags;
      local_40[10] = filepath._M_len;
      local_40[0xb] = filepath._M_str;
      local_40[2] = 0;
      local_40[3] = 0;
      local_40[4] = 0;
      *(undefined1 *)(local_40 + 7) = 0;
      *(undefined1 *)(local_40 + 0x11) = 0;
    }
    async_simple::coro::syncAwait<async_simple::coro::Lazy<async_simple::Try<bool>>&>
              ((Try<bool> *)&local_38,(coro *)&local_40,lazy);
    pbVar2 = async_simple::Try<bool>::value((Try<bool> *)&local_38);
    uVar3 = *pbVar2;
    std::__detail::__variant::
    _Variant_storage<false,_std::monostate,_bool,_std::__exception_ptr::exception_ptr>::
    ~_Variant_storage(&local_38);
    if (local_40 != (undefined8 *)0x0) {
      (*(code *)local_40[1])();
    }
  }
  return (bool)uVar3;
}

Assistant:

bool open_stream_file_in_pool(std::string_view filepath,
                                std::ios::ios_base::openmode flags) {
    if (frw_seq_file_.is_open()) {
      return true;
    }
    auto coro_func = coro_io::post(
        [this, flags, filepath]() mutable {
          frw_seq_file_.open(filepath.data(), flags);
          if (!frw_seq_file_.is_open()) {
            std::cout << "line " << __LINE__ << " coro_file open failed "
                      << filepath << "\n";
            std::cerr << "Error: " << strerror(errno);
            return false;
          }
          return true;
        },
        &executor_wrapper_);
    auto result = async_simple::coro::syncAwait(coro_func);
    return result.value();
  }